

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O3

void __thiscall
Js::AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'_',_(unsigned_char)'\x03'>::
AuxPtrsFix(AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
           *this,AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
                 *ptr16)

{
  void *pvVar1;
  
  this->ptr[0].ptr = (void *)0x0;
  this->ptr[1].ptr = (void *)0x0;
  this->ptr[2].ptr = (void *)0x0;
  this->count = '\x03';
  this->type[0] = ptr16->type[0];
  pvVar1 = ptr16->ptr[0].ptr;
  Memory::Recycler::WBSetBit((char *)this->ptr);
  this->ptr[0].ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this->ptr);
  if (1 < this->count) {
    memset(this->type + 1,0xff,(ulong)(byte)(this->count - 1));
    return;
  }
  return;
}

Assistant:

AuxPtrsFix<FieldsEnum, size, _MaxCount>::AuxPtrsFix(AuxPtrsFix<FieldsEnum, 16>* ptr16)
    {
        static_assert(_MaxCount == AuxPtrsFix<FieldsEnum, 32>::MaxCount, "Should only be called on AuxPtrsFix<FieldsEnum, 32>");
        this->count = AuxPtrsFix<FieldsEnum, 32>::MaxCount;
        for (uint8 i = 0; i < AuxPtrsFix<FieldsEnum, 16>::MaxCount; i++)
        {
            this->type[i] = ptr16->type[i];
            this->ptr[i] = ptr16->ptr[i];
        }
        for (uint8 i = AuxPtrsFix<FieldsEnum, 16>::MaxCount; i < count; i++)
        {
            this->type[i] = FieldsEnum::Invalid;
        }
    }